

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall
kj::Exception::setDetail(Exception *this,DetailTypeId typeId,Array<unsigned_char> *value)

{
  Detail *pDVar1;
  DetailTypeId DVar2;
  uchar *puVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  RemoveConst<kj::Exception::Detail> *pRVar6;
  size_t newSize;
  Detail *pDVar7;
  bool bVar8;
  
  pDVar7 = (this->details).builder.ptr;
  pDVar1 = (this->details).builder.pos;
  bVar8 = pDVar7 == pDVar1;
  if (!bVar8) {
    DVar2 = pDVar7->id;
    while (DVar2 != typeId) {
      pDVar7 = pDVar7 + 1;
      bVar8 = pDVar7 == pDVar1;
      if (bVar8) goto LAB_0027e9fd;
      DVar2 = pDVar7->id;
    }
    puVar3 = (pDVar7->value).ptr;
    if (puVar3 != (uchar *)0x0) {
      sVar4 = (pDVar7->value).size_;
      (pDVar7->value).ptr = (uchar *)0x0;
      (pDVar7->value).size_ = 0;
      pAVar5 = (pDVar7->value).disposer;
      (*(code *)**(undefined8 **)pAVar5)(pAVar5,puVar3,1,sVar4,sVar4,0);
    }
    (pDVar7->value).ptr = value->ptr;
    (pDVar7->value).size_ = value->size_;
    (pDVar7->value).disposer = value->disposer;
    value->ptr = (uchar *)0x0;
    value->size_ = 0;
    if (!bVar8) {
      return;
    }
  }
LAB_0027e9fd:
  puVar3 = value->ptr;
  sVar4 = value->size_;
  pAVar5 = value->disposer;
  value->ptr = (uchar *)0x0;
  value->size_ = 0;
  pDVar7 = (this->details).builder.endPtr;
  if ((this->details).builder.pos == pDVar7) {
    pDVar1 = (this->details).builder.ptr;
    newSize = 4;
    if (pDVar7 != pDVar1) {
      newSize = (long)pDVar7 - (long)pDVar1 >> 4;
    }
    Vector<kj::Exception::Detail>::setCapacity(&this->details,newSize);
  }
  pRVar6 = (this->details).builder.pos;
  pRVar6->id = typeId;
  (pRVar6->value).ptr = puVar3;
  (pRVar6->value).size_ = sVar4;
  (pRVar6->value).disposer = pAVar5;
  (this->details).builder.pos = pRVar6 + 1;
  return;
}

Assistant:

void Exception::setDetail(DetailTypeId typeId, kj::Array<byte> value) {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      detail.value = kj::mv(value);
      return;
    }
  }
  details.add(Detail {
    .id = typeId,
    .value = kj::mv(value),
  });
}